

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_dump_image_header(opj_image_t *img_header,opj_bool dev_dump_flag,FILE *out_stream)

{
  FILE *in_RDX;
  int in_ESI;
  uint *in_RDI;
  int compno;
  char tab [2];
  uint uVar1;
  undefined2 in_stack_ffffffffffffffe4;
  undefined1 uVar2;
  undefined1 in_stack_ffffffffffffffe7;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI == 0) {
    fprintf(in_RDX,"Image info {\n");
    uVar2 = 9;
    in_stack_ffffffffffffffe7 = 0;
  }
  else {
    fprintf(_stdout,"[DEV] Dump an image_header struct {\n");
    uVar2 = 0;
  }
  fprintf(in_RDX,"%s x0=%d, y0=%d\n",&stack0xffffffffffffffe6,(ulong)*in_RDI,(ulong)in_RDI[1]);
  fprintf(in_RDX,"%s x1=%d, y1=%d\n",&stack0xffffffffffffffe6,(ulong)in_RDI[2],(ulong)in_RDI[3]);
  fprintf(in_RDX,"%s numcomps=%d\n",&stack0xffffffffffffffe6,(ulong)in_RDI[4]);
  if (*(long *)(in_RDI + 6) != 0) {
    for (uVar1 = 0; uVar1 < in_RDI[4]; uVar1 = uVar1 + 1) {
      fprintf(in_RDX,"%s\t component %d {\n",&stack0xffffffffffffffe6,(ulong)uVar1);
      j2k_dump_image_comp_header
                ((opj_image_comp_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 (opj_bool)((ulong)in_RDX >> 0x20),
                 (FILE *)CONCAT17(in_stack_ffffffffffffffe7,
                                  CONCAT16(uVar2,CONCAT24(in_stack_ffffffffffffffe4,uVar1))));
      fprintf(in_RDX,"%s}\n",&stack0xffffffffffffffe6);
    }
  }
  fprintf(in_RDX,"}\n");
  return;
}

Assistant:

void j2k_dump_image_header(opj_image_t* img_header, opj_bool dev_dump_flag, FILE* out_stream)
{
	char tab[2];

	if (dev_dump_flag){
		fprintf(stdout, "[DEV] Dump an image_header struct {\n");
		tab[0] = '\0';
	}
	else {
		fprintf(out_stream, "Image info {\n");
		tab[0] = '\t';tab[1] = '\0';
	}

	fprintf(out_stream, "%s x0=%d, y0=%d\n", tab, img_header->x0, img_header->y0);
	fprintf(out_stream,	"%s x1=%d, y1=%d\n", tab, img_header->x1, img_header->y1);
	fprintf(out_stream, "%s numcomps=%d\n", tab, img_header->numcomps);

	if (img_header->comps){
		int compno;
		for (compno = 0; compno < img_header->numcomps; compno++) {
			fprintf(out_stream, "%s\t component %d {\n", tab, compno);
			j2k_dump_image_comp_header(&(img_header->comps[compno]), dev_dump_flag, out_stream);
			fprintf(out_stream,"%s}\n",tab);
		}
	}

	fprintf(out_stream, "}\n");
}